

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_DeadWallDraw_TestShell::TEST_WiningStateTest_DeadWallDraw_TestShell
          (TEST_WiningStateTest_DeadWallDraw_TestShell *this)

{
  TEST_WiningStateTest_DeadWallDraw_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)&PTR__TEST_WiningStateTest_DeadWallDraw_TestShell_0025c010;
  return;
}

Assistant:

TEST(WiningStateTest, DeadWallDraw)
{
	addNoWiningHand(true);

	SelfDrawnSituation situation;
	situation.is_dead_wall = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DeadWallDraw));
	CHECK_EQUAL(1, r.doubling_factor);
}